

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.h
# Opt level: O0

void __thiscall TestMetrics::TestMetrics(TestMetrics *this,int label,Metrics *metrics)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_type sVar3;
  ulong uVar4;
  void *pvVar5;
  reference pvVar6;
  undefined8 *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  int i;
  int local_1c;
  
  *in_RDI = *in_RDX;
  in_RDI[1] = in_RDX[1];
  in_RDI[2] = in_RDX[2];
  *(undefined4 *)((long)in_RDI + 0x1c) = in_ESI;
  sVar3 = std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::size
                    ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
                     (in_RDX + 3));
  *(int *)(in_RDI + 3) = (int)sVar3;
  if (*(int *)(in_RDI + 3) == 0) {
    in_RDI[4] = 0;
    in_RDI[5] = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)*(int *)(in_RDI + 3);
    uVar4 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    in_RDI[4] = pvVar5;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)*(int *)(in_RDI + 3);
    uVar4 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    in_RDI[5] = pvVar5;
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 3); local_1c = local_1c + 1) {
      pvVar6 = std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
               operator[]((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                           *)(in_RDX + 3),(long)local_1c);
      *(float *)(in_RDI[4] + (long)local_1c * 4) = pvVar6->first;
      pvVar6 = std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
               operator[]((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                           *)(in_RDX + 3),(long)local_1c);
      *(float *)(in_RDI[5] + (long)local_1c * 4) = pvVar6->second;
    }
  }
  return;
}

Assistant:

explicit TestMetrics(int label, Meter::Metrics& metrics)
    {
        gold = metrics.gold;
        predicted = metrics.predicted;
        predictedGold = metrics.predictedGold;
        this->label = label;

        scoresLen = metrics.scoreVsTrue.size();

        if (scoresLen == 0)
        {
            predictedScores = nullptr;
            goldScores = nullptr;

            return;
        }

        predictedScores = new float[scoresLen];
        goldScores = new float[scoresLen];

        for (int i = 0; i<scoresLen; ++i) {
            predictedScores[i] = metrics.scoreVsTrue[i].first;
            goldScores[i] = metrics.scoreVsTrue[i].second;
        }
    }